

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O3

void __thiscall
leveldb::log::LogTest_ShortTrailer_Test::~LogTest_ShortTrailer_Test(LogTest_ShortTrailer_Test *this)

{
  LogTest::~LogTest(&this->super_LogTest);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(LogTest, ShortTrailer) {
  const int n = kBlockSize - 2 * kHeaderSize + 4;
  Write(BigString("foo", n));
  ASSERT_EQ(kBlockSize - kHeaderSize + 4, WrittenBytes());
  Write("");
  Write("bar");
  ASSERT_EQ(BigString("foo", n), Read());
  ASSERT_EQ("", Read());
  ASSERT_EQ("bar", Read());
  ASSERT_EQ("EOF", Read());
}